

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O3

void save_shifts(void)

{
  Yshort *pYVar1;
  Yshort YVar2;
  shifts *psVar3;
  Yshort *pYVar4;
  long lVar5;
  shifts **ppsVar6;
  Yshort *pYVar7;
  
  psVar3 = (shifts *)allocate(nshifts * 4 + 0x14);
  psVar3->number = this_state->number;
  lVar5 = (long)nshifts;
  psVar3->nshifts = nshifts;
  if (0 < lVar5) {
    pYVar1 = shiftset + lVar5;
    pYVar7 = psVar3->shift;
    pYVar4 = shiftset;
    do {
      YVar2 = *pYVar4;
      pYVar4 = pYVar4 + 1;
      *pYVar7 = YVar2;
      pYVar7 = pYVar7 + 1;
    } while (pYVar4 < pYVar1);
  }
  ppsVar6 = &first_shift;
  if (last_shift != (shifts *)0x0) {
    ppsVar6 = &last_shift->next;
  }
  ((shifts *)ppsVar6)->next = psVar3;
  last_shift = psVar3;
  return;
}

Assistant:

void save_shifts()
{
    register shifts *p;
    register Yshort *sp1;
    register Yshort *sp2;
    register Yshort *send;

    p = (shifts *) allocate((unsigned) (sizeof(shifts) +
			(nshifts - 1) * sizeof(Yshort)));

    p->number = this_state->number;
    p->nshifts = nshifts;

    sp1 = shiftset;
    sp2 = p->shift;
    send = shiftset + nshifts;

    while (sp1 < send)
	*sp2++ = *sp1++;

    if (last_shift)
    {
	last_shift->next = p;
	last_shift = p;
    }
    else
    {
	first_shift = p;
	last_shift = p;
    }
}